

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp.c
# Opt level: O2

LispPTR N_OP_fgreaterp(LispPTR parg1,LispPTR parg2)

{
  ushort uVar1;
  LispPTR LVar2;
  float *pfVar3;
  LispPTR *pLVar4;
  float fVar5;
  float fVar6;
  
  if ((parg1 & 0xfff0000) == 0xf0000) {
    fVar6 = (float)(int)(parg1 | 0xffff0000);
LAB_0011cfd1:
    if ((parg2 & 0xfff0000) == 0xf0000) {
      fVar5 = (float)(int)(parg2 | 0xffff0000);
    }
    else if ((parg2 & 0xfff0000) == 0xe0000) {
      fVar5 = (float)(parg2 & 0xffff);
    }
    else {
      uVar1 = *(ushort *)((ulong)(parg2 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
      if (uVar1 == 2) {
        pLVar4 = NativeAligned4FromLAddr(parg2);
        fVar5 = (float)(int)*pLVar4;
      }
      else {
        if (uVar1 != 3) goto LAB_0011d03c;
        pfVar3 = (float *)NativeAligned4FromLAddr(parg2);
        fVar5 = *pfVar3;
      }
    }
    LVar2 = 0x4c;
    if (fVar6 <= fVar5) {
      LVar2 = 0;
    }
  }
  else {
    if ((parg1 & 0xfff0000) == 0xe0000) {
      fVar6 = (float)(parg1 & 0xffff);
      goto LAB_0011cfd1;
    }
    uVar1 = *(ushort *)((ulong)(parg1 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
    if (uVar1 == 2) {
      pLVar4 = NativeAligned4FromLAddr(parg1);
      fVar6 = (float)(int)*pLVar4;
      goto LAB_0011cfd1;
    }
    if (uVar1 == 3) {
      pfVar3 = (float *)NativeAligned4FromLAddr(parg1);
      fVar6 = *pfVar3;
      goto LAB_0011cfd1;
    }
LAB_0011d03c:
    MachineState.errorexit = 1;
    LVar2 = 0xffffffff;
    MachineState.tosvalue = parg2;
  }
  return LVar2;
}

Assistant:

LispPTR N_OP_fgreaterp(LispPTR parg1, LispPTR parg2) {
  float arg1, arg2;

  N_MakeFloat(parg1, arg1, parg2);
  N_MakeFloat(parg2, arg2, parg2);
  if (arg1 > arg2)
    return (ATOM_T);
  else
    return (NIL_PTR);
}